

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::LJoint::Prepare(LJoint *this,btScalar dt,int iterations)

{
  btVector3 *v2;
  btTransform *pbVar1;
  btVector3 *pbVar2;
  long in_RDI;
  btScalar bVar3;
  btMatrix3x3 *iib;
  btVector3 *ra;
  btVector3 bVar4;
  int in_stack_fffffffffffffef8;
  btScalar in_stack_fffffffffffffefc;
  Joint *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Body *in_stack_ffffffffffffff18;
  float local_c4;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  Body *in_stack_ffffffffffffff58;
  btMatrix3x3 local_a0;
  btVector3 *rb;
  btScalar imb;
  btMatrix3x3 *iia;
  btScalar ima;
  
  Joint::Prepare(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  Body::xform(in_stack_ffffffffffffff18);
  bVar4 = btTransform::operator*
                    ((btTransform *)in_stack_ffffffffffffff00,
                     (btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  v2 = (btVector3 *)(in_RDI + 0xb8);
  *(long *)(in_RDI + 0xb8) = bVar4.m_floats._0_8_;
  *(long *)(in_RDI + 0xc0) = bVar4.m_floats._8_8_;
  Body::xform(in_stack_ffffffffffffff18);
  bVar4 = btTransform::operator*
                    ((btTransform *)in_stack_ffffffffffffff00,
                     (btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  *(long *)(in_RDI + 200) = bVar4.m_floats._0_8_;
  *(long *)(in_RDI + 0xd0) = bVar4.m_floats._8_8_;
  bVar4 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),v2);
  iib = bVar4.m_floats._8_8_;
  rb = bVar4.m_floats._0_8_;
  bVar4 = Clamp((btVector3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                (btScalar)((ulong)v2 >> 0x20));
  ra = bVar4.m_floats._8_8_;
  imb = bVar4.m_floats[1];
  bVar4 = ::operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      v2->m_floats);
  ima = bVar4.m_floats[3];
  iia = bVar4.m_floats._0_8_;
  bVar4 = operator/((btVector3 *)in_stack_ffffffffffffff00,
                    (btScalar *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  *(long *)(in_RDI + 100) = bVar4.m_floats._0_8_;
  *(long *)(in_RDI + 0x6c) = bVar4.m_floats._8_8_;
  pbVar1 = Body::xform(in_stack_ffffffffffffff18);
  pbVar2 = btTransform::getOrigin(pbVar1);
  btVector3::operator-=((btVector3 *)(in_RDI + 0xb8),pbVar2);
  pbVar1 = Body::xform(in_stack_ffffffffffffff18);
  pbVar2 = btTransform::getOrigin(pbVar1);
  btVector3::operator-=((btVector3 *)(in_RDI + 200),pbVar2);
  bVar3 = Body::invMass((Body *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Body::invWorldInertia(in_stack_ffffffffffffff58);
  Body::invMass((Body *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Body::invWorldInertia(in_stack_ffffffffffffff58);
  ImpulseMatrix(ima,iia,ra,imb,iib,rb);
  btMatrix3x3::operator=((btMatrix3x3 *)(in_RDI + 0x84),&local_a0);
  if (0.0 < *(float *)(in_RDI + 0x60)) {
    in_stack_ffffffffffffff00 = (Joint *)(in_RDI + 0x84);
    bVar4 = ::operator*((btVector3 *)CONCAT44(bVar3,in_stack_ffffffffffffff10),v2->m_floats);
    local_b8 = bVar4.m_floats._8_8_;
    local_c0 = bVar4.m_floats._0_8_;
    bVar4 = ::operator*((btMatrix3x3 *)CONCAT44(bVar3,in_stack_ffffffffffffff10),v2);
    local_b0 = bVar4.m_floats._0_8_;
    *(undefined8 *)(in_RDI + 0x74) = local_b0;
    *(long *)(in_RDI + 0x7c) = bVar4.m_floats._8_8_;
    local_c4 = 1.0 - *(float *)(in_RDI + 0x60);
    btVector3::operator*=((btVector3 *)(in_RDI + 100),&local_c4);
  }
  btVector3::operator/=
            ((btVector3 *)in_stack_ffffffffffffff00,
             (btScalar *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  return;
}

Assistant:

void				btSoftBody::LJoint::Prepare(btScalar dt,int iterations)
{
	static const btScalar	maxdrift=4;
	Joint::Prepare(dt,iterations);
	m_rpos[0]		=	m_bodies[0].xform()*m_refs[0];
	m_rpos[1]		=	m_bodies[1].xform()*m_refs[1];
	m_drift			=	Clamp(m_rpos[0]-m_rpos[1],maxdrift)*m_erp/dt;
	m_rpos[0]		-=	m_bodies[0].xform().getOrigin();
	m_rpos[1]		-=	m_bodies[1].xform().getOrigin();
	m_massmatrix	=	ImpulseMatrix(	m_bodies[0].invMass(),m_bodies[0].invWorldInertia(),m_rpos[0],
		m_bodies[1].invMass(),m_bodies[1].invWorldInertia(),m_rpos[1]);
	if(m_split>0)
	{
		m_sdrift	=	m_massmatrix*(m_drift*m_split);
		m_drift		*=	1-m_split;
	}
	m_drift	/=(btScalar)iterations;
}